

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_cast_expression.cpp
# Opt level: O1

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::BoundCastExpression::AddDefaultCastToType
          (BoundCastExpression *this,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr,
          LogicalType *target_type,bool try_cast)

{
  pointer pEVar1;
  GetCastFunctionInput get_input;
  CastFunctionSet default_set;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_60;
  GetCastFunctionInput local_58;
  CastFunctionSet local_48;
  
  CastFunctionSet::CastFunctionSet(&local_48);
  local_58.context.ptr = (ClientContext *)0x0;
  local_58.query_location.index = 0xffffffffffffffff;
  pEVar1 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (expr);
  local_58.query_location.index = (pEVar1->super_BaseExpression).query_location.index;
  local_60._M_head_impl =
       (expr->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (expr->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  AddCastToTypeInternal
            ((duckdb *)this,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_60,target_type,&local_48,&local_58,try_cast);
  if (local_60._M_head_impl != (Expression *)0x0) {
    (*((local_60._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  local_60._M_head_impl = (Expression *)0x0;
  ::std::vector<duckdb::BindCastFunction,_std::allocator<duckdb::BindCastFunction>_>::~vector
            (&local_48.bind_functions.
              super_vector<duckdb::BindCastFunction,_std::allocator<duckdb::BindCastFunction>_>);
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> BoundCastExpression::AddDefaultCastToType(unique_ptr<Expression> expr,
                                                                 const LogicalType &target_type, bool try_cast) {
	CastFunctionSet default_set;
	GetCastFunctionInput get_input;
	get_input.query_location = expr->GetQueryLocation();
	return AddCastToTypeInternal(std::move(expr), target_type, default_set, get_input, try_cast);
}